

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

void __thiscall
ONX_ModelComponentIterator::Internal_SetLink
          (ONX_ModelComponentIterator *this,ONX_ModelComponentReferenceLink *link)

{
  ON__UINT64 OVar1;
  ON__UINT64 local_30;
  ON__UINT64 local_28;
  ONX_ModelComponentReferenceLink *link_local;
  ONX_ModelComponentIterator *this_local;
  
  OVar1 = ONX_Model::ModelContentVersionNumber(this->m_model);
  this->m_model_content_version = OVar1;
  this->m_link = link;
  if (this->m_link == (ONX_ModelComponentReferenceLink *)0x0) {
    this->m_current_component_sn = 0;
    this->m_next_component_sn = 0;
    this->m_prev_component_sn = 0;
    ON_ModelComponentWeakReference::operator=
              (&this->m_current_component_weak_ref,&ON_ModelComponentWeakReference::Empty);
    this->m_model_content_version = 0;
  }
  else {
    this->m_current_component_sn = link->m_sn;
    if (link->m_next == (ONX_ModelComponentReferenceLink *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = link->m_next->m_sn;
    }
    this->m_next_component_sn = local_28;
    if (link->m_prev == (ONX_ModelComponentReferenceLink *)0x0) {
      local_30 = 0;
    }
    else {
      local_30 = link->m_prev->m_sn;
    }
    this->m_prev_component_sn = local_30;
    ON_ModelComponentWeakReference::operator=(&this->m_current_component_weak_ref,&link->m_mcr);
  }
  return;
}

Assistant:

void ONX_ModelComponentIterator::Internal_SetLink(
  const class ONX_ModelComponentReferenceLink* link
  ) const
{
  // m_model is never nullptr when this function is called
  m_model_content_version = m_model->ModelContentVersionNumber();
  m_link = link;
  if (nullptr == m_link)
  {
    m_current_component_sn = 0;
    m_next_component_sn = 0;
    m_prev_component_sn = 0;
    m_current_component_weak_ref = ON_ModelComponentWeakReference::Empty;
    m_model_content_version = 0;
  }
  else
  {
    m_current_component_sn = link->m_sn;
    m_next_component_sn = (nullptr != link->m_next) ? link->m_next->m_sn : 0;
    m_prev_component_sn = (nullptr != link->m_prev) ? link->m_prev->m_sn : 0;
    m_current_component_weak_ref = link->m_mcr;
  }
}